

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

_glist * canvas_new(void *dummy,t_symbol *sel,int argc,t_atom *argv)

{
  int iVar1;
  _glist *x_00;
  _glist *p_Var2;
  _canvasenvironment *p_Var3;
  t_atom *ptVar4;
  t_symbol *ptVar5;
  bool bVar6;
  t_float tVar7;
  int local_88;
  t_symbol *local_80;
  t_symbol *local_78;
  int local_6c;
  _glist *local_68;
  _glist *zzz;
  _canvasenvironment *env;
  int font;
  int yloc;
  int xloc;
  int height;
  int width;
  int vis;
  t_symbol *s;
  _glist *owner;
  _glist *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *sel_local;
  void *dummy_local;
  
  x_00 = (_glist *)pd_new(canvas_class);
  p_Var2 = canvas_getcurrent();
  _width = &s_;
  height = 0;
  xloc = 0x1c2;
  yloc = 300;
  font = 0;
  env._4_4_ = 0x32;
  if (p_Var2 == (_glist *)0x0) {
    local_6c = sys_defaultfont;
  }
  else {
    local_6c = p_Var2->gl_font;
  }
  env._0_4_ = local_6c;
  glist_init(x_00);
  (x_00->gl_obj).field_0x2e = (x_00->gl_obj).field_0x2e & 0xfc | 1;
  if (p_Var2 == (_glist *)0x0) {
    canvas_addtolist(x_00);
  }
  if (argc == 5) {
    tVar7 = atom_getfloatarg(0,5,argv);
    font = (int)tVar7;
    tVar7 = atom_getfloatarg(1,5,argv);
    env._4_4_ = (int)tVar7;
    tVar7 = atom_getfloatarg(2,5,argv);
    xloc = (int)tVar7;
    tVar7 = atom_getfloatarg(3,5,argv);
    yloc = (int)tVar7;
    tVar7 = atom_getfloatarg(4,5,argv);
    env._0_4_ = (int)tVar7;
  }
  else if (argc == 6) {
    tVar7 = atom_getfloatarg(0,6,argv);
    font = (int)tVar7;
    tVar7 = atom_getfloatarg(1,6,argv);
    env._4_4_ = (int)tVar7;
    tVar7 = atom_getfloatarg(2,6,argv);
    xloc = (int)tVar7;
    tVar7 = atom_getfloatarg(3,6,argv);
    yloc = (int)tVar7;
    _width = atom_getsymbolarg(4,6,argv);
    tVar7 = atom_getfloatarg(5,6,argv);
    height = (int)tVar7;
  }
  if (((pd_maininstance.pd_gui)->i_newdirectory == (t_symbol *)0x0) ||
     (*(pd_maininstance.pd_gui)->i_newdirectory->s_name == '\0')) {
    x_00->gl_env = (_canvasenvironment *)0x0;
  }
  else {
    p_Var3 = (_canvasenvironment *)getbytes(0x28);
    x_00->gl_env = p_Var3;
    if ((pd_maininstance.pd_gui)->i_newargv == (t_atom *)0x0) {
      ptVar4 = (t_atom *)getbytes(0);
      (pd_maininstance.pd_gui)->i_newargv = ptVar4;
    }
    p_Var3->ce_dir = (pd_maininstance.pd_gui)->i_newdirectory;
    p_Var3->ce_argc = (pd_maininstance.pd_gui)->i_newargc;
    p_Var3->ce_argv = (pd_maininstance.pd_gui)->i_newargv;
    iVar1 = (pd_maininstance.pd_gui)->i_dollarzero;
    (pd_maininstance.pd_gui)->i_dollarzero = iVar1 + 1;
    p_Var3->ce_dollarzero = iVar1;
    p_Var3->ce_path = (t_namelist *)0x0;
    (pd_maininstance.pd_gui)->i_newdirectory = &s_;
    (pd_maininstance.pd_gui)->i_newargc = 0;
    (pd_maininstance.pd_gui)->i_newargv = (t_atom *)0x0;
  }
  canvas_undo_init(x_00);
  x_00->gl_x1 = 0.0;
  x_00->gl_y1 = 0.0;
  x_00->gl_x2 = 1.0;
  x_00->gl_y2 = 1.0;
  canvas_dosetbounds(x_00,font,env._4_4_,font + xloc,env._4_4_ + yloc);
  x_00->gl_owner = p_Var2;
  *(ushort *)&x_00->field_0xe8 = *(ushort *)&x_00->field_0xe8 & 0xf7ff;
  if (*_width->s_name == '\0') {
    if ((pd_maininstance.pd_gui)->i_newfilename == (t_symbol *)0x0) {
      local_80 = gensym("Pd");
    }
    else {
      local_80 = (pd_maininstance.pd_gui)->i_newfilename;
    }
    local_78 = local_80;
  }
  else {
    local_78 = _width;
  }
  x_00->gl_name = local_78;
  canvas_bind(x_00);
  *(ushort *)&x_00->field_0xe8 = *(ushort *)&x_00->field_0xe8 & 0xfff7 | 8;
  *(ushort *)&x_00->field_0xe8 = *(ushort *)&x_00->field_0xe8 & 0xff7f;
  if (((height != 0) && (ptVar5 = gensym("#X"), ptVar5->s_thing != (_class **)0x0)) &&
     (ptVar5 = gensym("#X"), *ptVar5->s_thing == canvas_class)) {
    ptVar5 = gensym("#X");
    local_68 = (_glist *)ptVar5->s_thing;
    while( true ) {
      bVar6 = false;
      if (local_68 != (_glist *)0x0) {
        bVar6 = local_68->gl_env == (_canvasenvironment *)0x0;
      }
      if (!bVar6) break;
      local_68 = local_68->gl_owner;
    }
    if (((local_68 != (_glist *)0x0) && (iVar1 = canvas_isabstraction(local_68), iVar1 != 0)) &&
       (local_68->gl_owner != (_glist *)0x0)) {
      height = 0;
    }
  }
  *(ushort *)&x_00->field_0xe8 = *(ushort *)&x_00->field_0xe8 & 0xffef | ((ushort)height & 1) << 4;
  iVar1 = strncmp(x_00->gl_name->s_name,"PDUNTITLED",10);
  *(ushort *)&x_00->field_0xe8 = *(ushort *)&x_00->field_0xe8 & 0xffdf | (ushort)(iVar1 == 0) << 5;
  iVar1 = sys_nearestfontsize((int)env);
  x_00->gl_font = iVar1;
  if (p_Var2 == (_glist *)0x0) {
    local_88 = 1;
  }
  else {
    local_88 = p_Var2->gl_zoom;
  }
  x_00->gl_zoom = local_88;
  pd_pushsym((t_pd *)x_00);
  return x_00;
}

Assistant:

t_canvas *canvas_new(void *dummy, t_symbol *sel, int argc, t_atom *argv)
{
    t_canvas *x = (t_canvas *)pd_new(canvas_class);
    t_canvas *owner = canvas_getcurrent();
    t_symbol *s = &s_;
    int vis = 0, width = GLIST_DEFCANVASWIDTH, height = GLIST_DEFCANVASHEIGHT;
    int xloc = GLIST_DEFCANVASXLOC, yloc = GLIST_DEFCANVASYLOC;
    int font = (owner ? owner->gl_font : sys_defaultfont);
    glist_init(x);
    x->gl_obj.te_type = T_OBJECT;
    if (!owner)
        canvas_addtolist(x);
    /* post("canvas %lx, owner %lx", x, owner); */

    if (argc == 5)  /* toplevel: x, y, w, h, font */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        font = atom_getfloatarg(4, argc, argv);
    }
    else if (argc == 6)  /* subwindow: x, y, w, h, name, vis */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        s = atom_getsymbolarg(4, argc, argv);
        vis = atom_getfloatarg(5, argc, argv);
    }

        /* (otherwise assume we're being created from the menu.) */
    if (THISGUI->i_newdirectory &&
        THISGUI->i_newdirectory->s_name[0])
    {
        t_canvasenvironment *env = x->gl_env =
            (t_canvasenvironment *)getbytes(sizeof(*x->gl_env));
        if (!THISGUI->i_newargv)
            THISGUI->i_newargv = getbytes(0);
        env->ce_dir = THISGUI->i_newdirectory;
        env->ce_argc = THISGUI->i_newargc;
        env->ce_argv = THISGUI->i_newargv;
        env->ce_dollarzero = THISGUI->i_dollarzero++;
        env->ce_path = 0;
        THISGUI->i_newdirectory = &s_;
        THISGUI->i_newargc = 0;
        THISGUI->i_newargv = 0;
    }
    else x->gl_env = 0;

        /* initialize private data, like the undo-queue */
    canvas_undo_init(x);

    x->gl_x1 = 0;
    x->gl_y1 = 0;
    x->gl_x2 = 1;
    x->gl_y2 = 1;
    canvas_dosetbounds(x, xloc, yloc, xloc + width, yloc + height);
    x->gl_owner = owner;
    x->gl_isclone = 0;
    x->gl_name = (*s->s_name ? s :
        (THISGUI->i_newfilename ? THISGUI->i_newfilename : gensym("Pd")));
    canvas_bind(x);
    x->gl_loading = 1;
    x->gl_goprect = 0;      /* no GOP rectangle unless it's turned on later */
        /* cancel "vis" flag if we're a subpatch of an
         abstraction inside another patch.  A separate mechanism prevents
         the toplevel abstraction from showing up. */
    if (vis && gensym("#X")->s_thing &&
        ((*gensym("#X")->s_thing) == canvas_class))
    {
        t_canvas *zzz = (t_canvas *)(gensym("#X")->s_thing);
        while (zzz && !zzz->gl_env)
            zzz = zzz->gl_owner;
        if (zzz && canvas_isabstraction(zzz) && zzz->gl_owner)
            vis = 0;
    }
    x->gl_willvis = vis;
    x->gl_edit = !UNTITLED_STRNCMP(x->gl_name->s_name);
    x->gl_font = sys_nearestfontsize(font);
    x->gl_zoom = (owner ? owner->gl_zoom : 1);
    pd_pushsym(&x->gl_pd);
    return(x);
}